

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::~BinaryInstWriter(BinaryInstWriter *this)

{
  BinaryInstWriter *this_local;
  
  std::
  unordered_map<wasm::Break_*,_wasm::Type,_std::hash<wasm::Break_*>,_std::equal_to<wasm::Break_*>,_std::allocator<std::pair<wasm::Break_*const,_wasm::Type>_>_>
  ::~unordered_map(&this->brIfsNeedingHandling);
  std::
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  ::~unordered_set(&this->deferredGets);
  std::
  unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
  ::~unordered_map(&this->extractedGets);
  InsertOrderedMap<wasm::Type,_unsigned_int>::~InsertOrderedMap(&this->scratchLocals);
  std::
  unordered_map<wasm::Type,_unsigned_long,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>_>
  ::~unordered_map(&this->numLocalsByType);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&this->localTypes);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&this->breakStack);
  std::
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
  ::~unordered_map(&this->mappedLocals);
  return;
}

Assistant:

BinaryInstWriter(WasmBinaryWriter& parent,
                   BufferWithRandomAccess& o,
                   Function* func,
                   bool sourceMap,
                   bool DWARF)
    : parent(parent), o(o), func(func), sourceMap(sourceMap), DWARF(DWARF) {}